

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O1

char * Varint::Skip32BackwardSlow(char *p,char *b)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  
  if (p < b) {
    __assert_fail("ptr >= base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0xf4,"static const char *Varint::Skip32BackwardSlow(const char *, const char *)")
    ;
  }
  if ((p == b) || (p[-1] < '\0')) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = p + -1;
    if ((pcVar3 != b) && (p[-2] < '\0')) {
      pcVar5 = p + -3;
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        pcVar3 = pcVar5 + 1;
        if ((pcVar3 == b) || (3 < uVar4)) break;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + -1;
        uVar2 = uVar4 + 1;
      } while (cVar1 < '\0');
      if (3 < uVar4) {
        pcVar3 = (char *)0x0;
      }
    }
  }
  return pcVar3;
}

Assistant:

const char* Varint::Skip32BackwardSlow(const char* p, const char* b) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* base = reinterpret_cast<const unsigned char*>(b);
  assert(ptr >= base);

  // If the initial pointer is at the base or if the previous byte is not
  // the last byte of a varint, we return nullptr since there is nothing to
  // skip.
  if (ptr == base) return nullptr;
  if (*(--ptr) > 127) return nullptr;

  for (int i = 0; i < 5; i++) {
    if (ptr == base)    return reinterpret_cast<const char*>(ptr);
    if (*(--ptr) < 128) return reinterpret_cast<const char*>(ptr + 1);
  }

  return nullptr; // value is too long to be a varint32
}